

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_trace_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  short *psVar2;
  ushort *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  short sVar32;
  int iVar33;
  parasail_result_t *ppVar34;
  __m128i *palVar35;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *palVar36;
  __m128i *ptr_01;
  __m128i *ptr_02;
  int16_t *ptr_03;
  uint uVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  undefined2 uVar47;
  int iVar48;
  long lVar49;
  __m128i *ptr_04;
  ulong uVar50;
  int iVar51;
  ulong uVar52;
  short sVar53;
  short sVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  short sVar68;
  short sVar70;
  short sVar71;
  short sVar74;
  short sVar76;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar66;
  short sVar78;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  short sVar67;
  short sVar69;
  short sVar72;
  short sVar75;
  short sVar77;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ulong uVar73;
  ushort uVar79;
  ulong uVar81;
  ushort uVar85;
  ushort uVar87;
  ushort uVar89;
  ushort uVar91;
  ushort uVar93;
  ushort uVar95;
  ushort uVar97;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined4 uVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  undefined1 in_XMM7 [16];
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  undefined1 in_XMM9 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar129 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar130 [16];
  int iVar133;
  int iVar134;
  int iVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar136;
  int iVar139;
  int iVar140;
  int iVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_f4;
  __m128i *local_e0;
  ushort local_88;
  ushort uStack_86;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  ushort uVar80;
  ushort uVar86;
  ushort uVar88;
  ushort uVar90;
  ushort uVar92;
  ushort uVar94;
  ushort uVar96;
  ushort uVar98;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_trace_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_trace_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_trace_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar37 = profile->s1Len;
        if ((int)uVar37 < 1) {
          parasail_nw_trace_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_trace_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar73 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_trace_striped_profile_sse41_128_16_cold_1();
          }
          else {
            uVar41 = uVar37 - 1;
            uVar50 = (ulong)uVar37 + 7 >> 3;
            iVar48 = -open;
            iVar38 = ppVar5->min;
            iVar42 = -iVar38;
            if (iVar38 != iVar48 && SBORROW4(iVar38,iVar48) == iVar38 + open < 0) {
              iVar42 = open;
            }
            iVar31 = ppVar5->max;
            ppVar34 = parasail_result_new_trace((int)uVar50,s2Len,0x10,0x10);
            if (ppVar34 != (parasail_result_t *)0x0) {
              iVar51 = (int)(uVar41 / uVar50);
              ppVar34->flag = ppVar34->flag | 0x8280801;
              palVar35 = parasail_memalign___m128i(0x10,uVar50);
              ptr = parasail_memalign___m128i(0x10,uVar50);
              ptr_00 = parasail_memalign___m128i(0x10,uVar50);
              palVar36 = parasail_memalign___m128i(0x10,uVar50);
              ptr_01 = parasail_memalign___m128i(0x10,uVar50);
              ptr_02 = parasail_memalign___m128i(0x10,uVar50);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_03 != (int16_t *)0x0 &&
                  (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)) &&
                  ((palVar36 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar35 != (__m128i *)0x0))) {
                iVar33 = s2Len + -1;
                auVar57 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar55 = auVar57._0_4_;
                auVar57 = pshuflw(auVar57,ZEXT416((uint)gap),0);
                uVar56 = auVar57._0_4_;
                uVar37 = iVar42 - 0x7fff;
                auVar57 = pshuflw(ZEXT416(uVar37),ZEXT416(uVar37),0);
                local_78 = auVar57._0_2_;
                uStack_76 = auVar57._2_2_;
                auVar58 = ZEXT416(CONCAT22((short)((uint)iVar38 >> 0x10),0x7ffe - (short)iVar31));
                auVar58 = pshuflw(auVar58,auVar58,0);
                lVar40 = (long)iVar48;
                uVar52 = 0;
                do {
                  lVar45 = 0;
                  lVar43 = lVar40;
                  do {
                    uVar47 = 0x8000;
                    if (-0x8000 < lVar43) {
                      uVar47 = (undefined2)lVar43;
                    }
                    *(undefined2 *)((long)&local_48 + lVar45 * 2) = uVar47;
                    lVar49 = lVar43 - (ulong)(uint)open;
                    if (lVar49 < -0x7fff) {
                      lVar49 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar45 * 2) = (short)lVar49;
                    lVar45 = lVar45 + 1;
                    lVar43 = lVar43 - uVar50 * (uint)gap;
                  } while (lVar45 != 8);
                  palVar35[uVar52][0] = local_48;
                  palVar35[uVar52][1] = lStack_40;
                  ptr_00[uVar52][0] = local_58;
                  ptr_00[uVar52][1] = lStack_50;
                  palVar36[uVar52][0] = local_58;
                  palVar36[uVar52][1] = lStack_50;
                  uVar52 = uVar52 + 1;
                  lVar40 = lVar40 - (ulong)(uint)gap;
                } while (uVar52 != uVar50);
                *ptr_03 = 0;
                auVar127 = _DAT_00906ca0;
                lVar40 = uVar73 - 1;
                auVar59._8_4_ = (int)lVar40;
                auVar59._0_8_ = lVar40;
                auVar59._12_4_ = (int)((ulong)lVar40 >> 0x20);
                auVar128._4_4_ = gap;
                auVar128._0_4_ = gap;
                auVar128._8_4_ = gap;
                auVar128._12_4_ = gap;
                iVar38 = -gap;
                iVar42 = 0;
                auVar126 = pmovsxbq(in_XMM9,0x100);
                auVar59 = auVar59 ^ _DAT_00906ca0;
                auVar138._8_4_ = 0xffffffff;
                auVar138._0_8_ = 0xffffffffffffffff;
                auVar138._12_4_ = 0xffffffff;
                auVar129 = pmovsxbd(in_XMM12,0x7060504);
                auVar130 = pmovsxwd(in_XMM13,0x8000800080008000);
                uVar52 = 0;
                do {
                  uVar99 = (undefined4)uVar52;
                  auVar105._8_4_ = uVar99;
                  auVar105._0_8_ = uVar52;
                  auVar105._12_4_ = (int)(uVar52 >> 0x20);
                  auVar100 = (auVar105 | auVar126) ^ auVar127;
                  lVar40 = auVar59._0_8_;
                  auVar101._0_8_ = -(ulong)(lVar40 < auVar100._0_8_);
                  lVar43 = auVar59._8_8_;
                  auVar101._8_8_ = -(ulong)(lVar43 < auVar100._8_8_);
                  auVar100 = pshuflw(in_XMM7,auVar101,0xe8);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  iVar136 = iVar48 - iVar42;
                  iVar139 = iVar38 - open;
                  iVar140 = iVar48 - (gap * 2 + iVar42);
                  iVar141 = iVar48 - (gap * 3 + iVar42);
                  iVar31 = auVar130._0_4_;
                  auVar137._0_4_ =
                       (uint)(iVar136 < iVar31) * iVar31 | (uint)(iVar136 >= iVar31) * iVar136;
                  iVar136 = auVar130._4_4_;
                  auVar137._4_4_ =
                       (uint)(iVar139 < iVar136) * iVar136 | (uint)(iVar139 >= iVar136) * iVar139;
                  iVar139 = auVar130._8_4_;
                  auVar137._8_4_ =
                       (uint)(iVar140 < iVar139) * iVar139 | (uint)(iVar140 >= iVar139) * iVar140;
                  iVar140 = auVar130._12_4_;
                  auVar137._12_4_ =
                       (uint)(iVar141 < iVar140) * iVar140 | (uint)(iVar141 >= iVar140) * iVar141;
                  if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 1] = (int16_t)auVar137._0_4_;
                  }
                  auVar101 = packssdw(auVar101,auVar101);
                  auVar101 = packssdw(auVar101 ^ auVar138,auVar101 ^ auVar138);
                  if ((auVar101 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 2] = (int16_t)auVar137._4_4_;
                  }
                  auVar101 = (auVar105 | _DAT_00903a80) ^ auVar127;
                  auVar102._0_8_ = -(ulong)(lVar40 < auVar101._0_8_);
                  auVar102._8_8_ = -(ulong)(lVar43 < auVar101._8_8_);
                  auVar100 = packssdw(auVar100,auVar102);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 3] = (int16_t)auVar137._8_4_;
                  }
                  auVar100 = pshufhw(auVar102,auVar102,0x84);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 4] = (int16_t)auVar137._12_4_;
                  }
                  auVar100._4_4_ = uVar99;
                  auVar100._0_4_ = uVar99;
                  auVar100._8_4_ = uVar99;
                  auVar100._12_4_ = uVar99;
                  auVar101 = pmulld(auVar100 | auVar129,auVar128);
                  iVar141 = iVar48 - auVar101._0_4_;
                  iVar133 = iVar48 - auVar101._4_4_;
                  iVar134 = iVar48 - auVar101._8_4_;
                  iVar135 = iVar48 - auVar101._12_4_;
                  auVar100 = (auVar105 | _DAT_00903ad0) ^ auVar127;
                  auVar103._0_8_ = -(ulong)(lVar40 < auVar100._0_8_);
                  auVar103._8_8_ = -(ulong)(lVar43 < auVar100._8_8_);
                  auVar100 = pshuflw(auVar101,auVar103,0xe8);
                  in_XMM7 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((in_XMM7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 5] =
                         (ushort)(iVar141 < iVar31) * auVar130._0_2_ |
                         (ushort)(iVar141 >= iVar31) * (short)iVar141;
                  }
                  auVar100 = packssdw(auVar103,auVar103);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((auVar100 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 6] =
                         (ushort)(iVar133 < iVar136) * auVar130._4_2_ |
                         (ushort)(iVar133 >= iVar136) * (short)iVar133;
                  }
                  auVar101 = (auVar105 | _DAT_00903ac0) ^ auVar127;
                  auVar106._0_8_ = -(ulong)(lVar40 < auVar101._0_8_);
                  auVar106._8_8_ = -(ulong)(lVar43 < auVar101._8_8_);
                  auVar100 = packssdw(auVar100,auVar106);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 7] =
                         (ushort)(iVar134 < iVar139) * auVar130._8_2_ |
                         (ushort)(iVar134 >= iVar139) * (short)iVar134;
                  }
                  auVar100 = pshufhw(auVar100,auVar106,0x84);
                  auVar100 = packssdw(auVar100 ^ auVar138,auVar100 ^ auVar138);
                  if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar52 + 8] =
                         (ushort)(iVar135 < iVar140) * auVar130._12_2_ |
                         (ushort)(iVar135 >= iVar140) * (short)iVar135;
                  }
                  uVar52 = uVar52 + 8;
                  iVar38 = iVar38 + gap * -8;
                  iVar42 = iVar42 + gap * 8;
                } while ((s2Len + 7U & 0xfffffff8) != uVar52);
                lVar43 = uVar50 * 0x10;
                lVar40 = 0;
                auVar59 = pmovsxbw(auVar59,0x808080808080808);
                do {
                  *(undefined1 (*) [16])((long)((ppVar34->field_4).rowcols)->score_row + lVar40) =
                       auVar59;
                  lVar40 = lVar40 + 0x10;
                } while (lVar43 != lVar40);
                uVar39 = (int)uVar50 - 1;
                lVar45 = 0;
                auVar59 = pmovsxbw(auVar126,0x202020202020202);
                auVar127 = pmovsxbw(auVar127,0x404040404040404);
                auVar128 = pmovsxbw(auVar138,0x1010101010101010);
                auVar138 = pmovsxbw(auVar137,0x4040404040404040);
                auVar126 = pmovsxbw(auVar130,0x2020202020202020);
                local_88 = auVar58._0_2_;
                uStack_86 = auVar58._2_2_;
                lVar40 = lVar43;
                uVar52 = 0;
                uVar110 = local_78;
                uVar111 = uStack_76;
                uVar112 = local_78;
                uVar113 = uStack_76;
                uVar114 = local_78;
                uVar115 = uStack_76;
                uVar116 = local_78;
                uVar117 = uStack_76;
                uVar118 = local_88;
                uVar119 = uStack_86;
                uVar120 = local_88;
                uVar121 = uStack_86;
                uVar122 = local_88;
                uVar123 = uStack_86;
                uVar124 = local_88;
                uVar125 = uStack_86;
                do {
                  local_e0 = ptr_01;
                  ptr_04 = ptr;
                  ptr_01 = palVar36;
                  ptr = palVar35;
                  uVar1 = ptr[uVar39][0];
                  auVar58._8_8_ = ptr[uVar39][1] << 0x10 | uVar1 >> 0x30;
                  auVar58._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_03[uVar52];
                  lVar49 = (long)ppVar5->mapper[(byte)s2[uVar52]] * uVar50;
                  uVar1 = uVar52 + 1;
                  uVar44 = 1;
                  lVar46 = 0;
                  auVar129._4_2_ = local_78;
                  auVar129._0_4_ = auVar57._0_4_;
                  auVar129._6_2_ = uStack_76;
                  auVar129._8_2_ = local_78;
                  auVar129._10_2_ = uStack_76;
                  auVar129._12_2_ = local_78;
                  auVar129._14_2_ = uStack_76;
                  do {
                    auVar130 = *(undefined1 (*) [16])((long)*ptr_00 + lVar46);
                    auVar58 = paddsw(auVar58,*(undefined1 (*) [16])
                                              ((long)pvVar4 + lVar46 + lVar49 * 0x10));
                    sVar32 = auVar130._0_2_;
                    uVar80 = auVar58._0_2_;
                    uVar79 = (ushort)((short)uVar80 < sVar32) * sVar32 |
                             ((short)uVar80 >= sVar32) * uVar80;
                    sVar9 = auVar130._2_2_;
                    uVar86 = auVar58._2_2_;
                    uVar85 = (ushort)((short)uVar86 < sVar9) * sVar9 |
                             ((short)uVar86 >= sVar9) * uVar86;
                    sVar54 = auVar130._4_2_;
                    uVar88 = auVar58._4_2_;
                    uVar87 = (ushort)((short)uVar88 < sVar54) * sVar54 |
                             ((short)uVar88 >= sVar54) * uVar88;
                    sVar72 = auVar130._6_2_;
                    uVar90 = auVar58._6_2_;
                    uVar89 = (ushort)((short)uVar90 < sVar72) * sVar72 |
                             ((short)uVar90 >= sVar72) * uVar90;
                    sVar12 = auVar130._8_2_;
                    uVar92 = auVar58._8_2_;
                    uVar91 = (ushort)((short)uVar92 < sVar12) * sVar12 |
                             ((short)uVar92 >= sVar12) * uVar92;
                    sVar15 = auVar130._10_2_;
                    uVar94 = auVar58._10_2_;
                    uVar93 = (ushort)((short)uVar94 < sVar15) * sVar15 |
                             ((short)uVar94 >= sVar15) * uVar94;
                    sVar18 = auVar130._12_2_;
                    uVar96 = auVar58._12_2_;
                    uVar98 = auVar58._14_2_;
                    uVar95 = (ushort)((short)uVar96 < sVar18) * sVar18 |
                             ((short)uVar96 >= sVar18) * uVar96;
                    sVar21 = auVar130._14_2_;
                    uVar97 = (ushort)((short)uVar98 < sVar21) * sVar21 |
                             ((short)uVar98 >= sVar21) * uVar98;
                    sVar7 = auVar129._0_2_;
                    auVar107._0_2_ =
                         (ushort)((short)uVar79 < sVar7) * sVar7 | ((short)uVar79 >= sVar7) * uVar79
                    ;
                    sVar10 = auVar129._2_2_;
                    auVar107._2_2_ =
                         (ushort)((short)uVar85 < sVar10) * sVar10 |
                         ((short)uVar85 >= sVar10) * uVar85;
                    sVar67 = auVar129._4_2_;
                    auVar107._4_2_ =
                         (ushort)((short)uVar87 < sVar67) * sVar67 |
                         ((short)uVar87 >= sVar67) * uVar87;
                    sVar75 = auVar129._6_2_;
                    auVar107._6_2_ =
                         (ushort)((short)uVar89 < sVar75) * sVar75 |
                         ((short)uVar89 >= sVar75) * uVar89;
                    sVar13 = auVar129._8_2_;
                    auVar107._8_2_ =
                         (ushort)((short)uVar91 < sVar13) * sVar13 |
                         ((short)uVar91 >= sVar13) * uVar91;
                    sVar16 = auVar129._10_2_;
                    auVar107._10_2_ =
                         (ushort)((short)uVar93 < sVar16) * sVar16 |
                         ((short)uVar93 >= sVar16) * uVar93;
                    sVar19 = auVar129._12_2_;
                    auVar107._12_2_ =
                         (ushort)((short)uVar95 < sVar19) * sVar19 |
                         ((short)uVar95 >= sVar19) * uVar95;
                    sVar22 = auVar129._14_2_;
                    auVar107._14_2_ =
                         (ushort)((short)uVar97 < sVar22) * sVar22 |
                         ((short)uVar97 >= sVar22) * uVar97;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar46) = auVar107;
                    auVar60._0_2_ = -(ushort)(uVar80 == auVar107._0_2_);
                    auVar60._2_2_ = -(ushort)(uVar86 == auVar107._2_2_);
                    auVar60._4_2_ = -(ushort)(uVar88 == auVar107._4_2_);
                    auVar60._6_2_ = -(ushort)(uVar90 == auVar107._6_2_);
                    auVar60._8_2_ = -(ushort)(uVar92 == auVar107._8_2_);
                    auVar60._10_2_ = -(ushort)(uVar94 == auVar107._10_2_);
                    auVar60._12_2_ = -(ushort)(uVar96 == auVar107._12_2_);
                    auVar60._14_2_ = -(ushort)(uVar98 == auVar107._14_2_);
                    auVar82._0_2_ = auVar59._0_2_ - (ushort)(sVar7 < (short)uVar79);
                    auVar82._2_2_ = auVar59._2_2_ - (ushort)(sVar10 < (short)uVar85);
                    auVar82._4_2_ = auVar59._4_2_ - (ushort)(sVar67 < (short)uVar87);
                    auVar82._6_2_ = auVar59._6_2_ - (ushort)(sVar75 < (short)uVar89);
                    auVar82._8_2_ = auVar59._8_2_ - (ushort)(sVar13 < (short)uVar91);
                    auVar82._10_2_ = auVar59._10_2_ - (ushort)(sVar16 < (short)uVar93);
                    auVar82._12_2_ = auVar59._12_2_ - (ushort)(sVar19 < (short)uVar95);
                    auVar82._14_2_ = auVar59._14_2_ - (ushort)(sVar22 < (short)uVar97);
                    auVar100 = pblendvb(auVar82,auVar127,auVar60);
                    auVar58 = *(undefined1 (*) [16])
                               ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar45);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar46) = auVar100;
                    *(undefined1 (*) [16])
                     ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar45) =
                         auVar58 | auVar100;
                    auVar24._4_4_ = uVar55;
                    auVar24._0_4_ = uVar55;
                    auVar24._8_4_ = uVar55;
                    auVar24._12_4_ = uVar55;
                    auVar131 = psubsw(auVar107,auVar24);
                    auVar26._4_4_ = uVar56;
                    auVar26._0_4_ = uVar56;
                    auVar26._8_4_ = uVar56;
                    auVar26._12_4_ = uVar56;
                    auVar58 = psubsw(auVar130,auVar26);
                    sVar8 = auVar131._0_2_;
                    sVar53 = auVar58._0_2_;
                    sVar11 = auVar131._2_2_;
                    sVar66 = auVar58._2_2_;
                    sVar69 = auVar131._4_2_;
                    sVar68 = auVar58._4_2_;
                    sVar77 = auVar131._6_2_;
                    sVar70 = auVar58._6_2_;
                    sVar14 = auVar131._8_2_;
                    sVar71 = auVar58._8_2_;
                    sVar17 = auVar131._10_2_;
                    sVar74 = auVar58._10_2_;
                    sVar20 = auVar131._12_2_;
                    sVar76 = auVar58._12_2_;
                    sVar78 = auVar58._14_2_;
                    sVar23 = auVar131._14_2_;
                    puVar3 = (ushort *)((long)*ptr_00 + lVar46);
                    *puVar3 = (ushort)(sVar53 < sVar8) * sVar8 | (ushort)(sVar53 >= sVar8) * sVar53;
                    puVar3[1] = (ushort)(sVar66 < sVar11) * sVar11 |
                                (ushort)(sVar66 >= sVar11) * sVar66;
                    puVar3[2] = (ushort)(sVar68 < sVar69) * sVar69 |
                                (ushort)(sVar68 >= sVar69) * sVar68;
                    puVar3[3] = (ushort)(sVar70 < sVar77) * sVar77 |
                                (ushort)(sVar70 >= sVar77) * sVar70;
                    puVar3[4] = (ushort)(sVar71 < sVar14) * sVar14 |
                                (ushort)(sVar71 >= sVar14) * sVar71;
                    puVar3[5] = (ushort)(sVar74 < sVar17) * sVar17 |
                                (ushort)(sVar74 >= sVar17) * sVar74;
                    puVar3[6] = (ushort)(sVar76 < sVar20) * sVar20 |
                                (ushort)(sVar76 >= sVar20) * sVar76;
                    puVar3[7] = (ushort)(sVar78 < sVar23) * sVar23 |
                                (ushort)(sVar78 >= sVar23) * sVar78;
                    auVar130._4_4_ = uVar56;
                    auVar130._0_4_ = uVar56;
                    auVar130._8_4_ = uVar56;
                    auVar130._12_4_ = uVar56;
                    auVar58 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar46),auVar130);
                    sVar53 = auVar58._0_2_;
                    sVar66 = auVar58._2_2_;
                    sVar68 = auVar58._4_2_;
                    sVar70 = auVar58._6_2_;
                    sVar71 = auVar58._8_2_;
                    sVar74 = auVar58._10_2_;
                    sVar76 = auVar58._12_2_;
                    sVar78 = auVar58._14_2_;
                    puVar3 = (ushort *)((long)*local_e0 + lVar46);
                    *puVar3 = (ushort)(sVar8 < sVar53) * sVar53 | (ushort)(sVar8 >= sVar53) * sVar8;
                    puVar3[1] = (ushort)(sVar11 < sVar66) * sVar66 |
                                (ushort)(sVar11 >= sVar66) * sVar11;
                    puVar3[2] = (ushort)(sVar69 < sVar68) * sVar68 |
                                (ushort)(sVar69 >= sVar68) * sVar69;
                    puVar3[3] = (ushort)(sVar77 < sVar70) * sVar70 |
                                (ushort)(sVar77 >= sVar70) * sVar77;
                    puVar3[4] = (ushort)(sVar14 < sVar71) * sVar71 |
                                (ushort)(sVar14 >= sVar71) * sVar14;
                    puVar3[5] = (ushort)(sVar17 < sVar74) * sVar74 |
                                (ushort)(sVar17 >= sVar74) * sVar17;
                    puVar3[6] = (ushort)(sVar20 < sVar76) * sVar76 |
                                (ushort)(sVar20 >= sVar76) * sVar20;
                    puVar3[7] = (ushort)(sVar23 < sVar78) * sVar78 |
                                (ushort)(sVar23 >= sVar78) * sVar23;
                    if (uVar1 < uVar73) {
                      auVar61._0_2_ = -(ushort)(sVar53 < sVar8);
                      auVar61._2_2_ = -(ushort)(sVar66 < sVar11);
                      auVar61._4_2_ = -(ushort)(sVar68 < sVar69);
                      auVar61._6_2_ = -(ushort)(sVar70 < sVar77);
                      auVar61._8_2_ = -(ushort)(sVar71 < sVar14);
                      auVar61._10_2_ = -(ushort)(sVar74 < sVar17);
                      auVar61._12_2_ = -(ushort)(sVar76 < sVar20);
                      auVar61._14_2_ = -(ushort)(sVar78 < sVar23);
                      auVar58 = pblendvb(auVar128,_DAT_00904d20,auVar61);
                      *(undefined1 (*) [16])
                       ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar40) = auVar58;
                    }
                    auVar27._4_4_ = uVar56;
                    auVar27._0_4_ = uVar56;
                    auVar27._8_4_ = uVar56;
                    auVar27._12_4_ = uVar56;
                    auVar83 = psubsw(auVar129,auVar27);
                    sVar53 = auVar83._0_2_;
                    sVar66 = auVar83._2_2_;
                    sVar68 = auVar83._4_2_;
                    sVar70 = auVar83._6_2_;
                    sVar71 = auVar83._8_2_;
                    sVar74 = auVar83._10_2_;
                    sVar76 = auVar83._12_2_;
                    sVar78 = auVar83._14_2_;
                    if (uVar44 < uVar50) {
                      piVar6 = ((ppVar34->field_4).rowcols)->score_row;
                      auVar62._0_2_ = -(ushort)(sVar53 < sVar8);
                      auVar62._2_2_ = -(ushort)(sVar66 < sVar11);
                      auVar62._4_2_ = -(ushort)(sVar68 < sVar69);
                      auVar62._6_2_ = -(ushort)(sVar70 < sVar77);
                      auVar62._8_2_ = -(ushort)(sVar71 < sVar14);
                      auVar62._10_2_ = -(ushort)(sVar74 < sVar17);
                      auVar62._12_2_ = -(ushort)(sVar76 < sVar20);
                      auVar62._14_2_ = -(ushort)(sVar78 < sVar23);
                      auVar58 = pblendvb(auVar138,auVar126,auVar62);
                      *(undefined1 (*) [16])((long)piVar6 + lVar46 + 0x10 + lVar45) =
                           auVar58 | *(undefined1 (*) [16])((long)piVar6 + lVar46 + 0x10 + lVar45);
                    }
                    uVar110 = ((short)uVar110 < (short)auVar107._0_2_) * auVar107._0_2_ |
                              ((short)uVar110 >= (short)auVar107._0_2_) * uVar110;
                    uVar111 = ((short)uVar111 < (short)auVar107._2_2_) * auVar107._2_2_ |
                              ((short)uVar111 >= (short)auVar107._2_2_) * uVar111;
                    uVar112 = ((short)uVar112 < (short)auVar107._4_2_) * auVar107._4_2_ |
                              ((short)uVar112 >= (short)auVar107._4_2_) * uVar112;
                    uVar113 = ((short)uVar113 < (short)auVar107._6_2_) * auVar107._6_2_ |
                              ((short)uVar113 >= (short)auVar107._6_2_) * uVar113;
                    uVar114 = ((short)uVar114 < (short)auVar107._8_2_) * auVar107._8_2_ |
                              ((short)uVar114 >= (short)auVar107._8_2_) * uVar114;
                    uVar115 = ((short)uVar115 < (short)auVar107._10_2_) * auVar107._10_2_ |
                              ((short)uVar115 >= (short)auVar107._10_2_) * uVar115;
                    uVar116 = ((short)uVar116 < (short)auVar107._12_2_) * auVar107._12_2_ |
                              ((short)uVar116 >= (short)auVar107._12_2_) * uVar116;
                    uVar117 = ((short)uVar117 < (short)auVar107._14_2_) * auVar107._14_2_ |
                              ((short)uVar117 >= (short)auVar107._14_2_) * uVar117;
                    uVar118 = (ushort)(sVar32 < (short)uVar118) * sVar32 |
                              (sVar32 >= (short)uVar118) * uVar118;
                    uVar119 = (ushort)(sVar9 < (short)uVar119) * sVar9 |
                              (sVar9 >= (short)uVar119) * uVar119;
                    uVar120 = (ushort)(sVar54 < (short)uVar120) * sVar54 |
                              (sVar54 >= (short)uVar120) * uVar120;
                    uVar121 = (ushort)(sVar72 < (short)uVar121) * sVar72 |
                              (sVar72 >= (short)uVar121) * uVar121;
                    uVar122 = (ushort)(sVar12 < (short)uVar122) * sVar12 |
                              (sVar12 >= (short)uVar122) * uVar122;
                    uVar123 = (ushort)(sVar15 < (short)uVar123) * sVar15 |
                              (sVar15 >= (short)uVar123) * uVar123;
                    uVar124 = (ushort)(sVar18 < (short)uVar124) * sVar18 |
                              (sVar18 >= (short)uVar124) * uVar124;
                    uVar125 = (ushort)(sVar21 < (short)uVar125) * sVar21 |
                              (sVar21 >= (short)uVar125) * uVar125;
                    uVar118 = (ushort)(sVar7 < (short)uVar118) * sVar7 |
                              (sVar7 >= (short)uVar118) * uVar118;
                    uVar119 = (ushort)(sVar10 < (short)uVar119) * sVar10 |
                              (sVar10 >= (short)uVar119) * uVar119;
                    uVar120 = (ushort)(sVar67 < (short)uVar120) * sVar67 |
                              (sVar67 >= (short)uVar120) * uVar120;
                    uVar121 = (ushort)(sVar75 < (short)uVar121) * sVar75 |
                              (sVar75 >= (short)uVar121) * uVar121;
                    uVar122 = (ushort)(sVar13 < (short)uVar122) * sVar13 |
                              (sVar13 >= (short)uVar122) * uVar122;
                    uVar123 = (ushort)(sVar16 < (short)uVar123) * sVar16 |
                              (sVar16 >= (short)uVar123) * uVar123;
                    uVar124 = (ushort)(sVar19 < (short)uVar124) * sVar19 |
                              (sVar19 >= (short)uVar124) * uVar124;
                    uVar125 = (ushort)(sVar22 < (short)uVar125) * sVar22 |
                              (sVar22 >= (short)uVar125) * uVar125;
                    uVar118 = ((short)auVar107._0_2_ < (short)uVar118) * auVar107._0_2_ |
                              ((short)auVar107._0_2_ >= (short)uVar118) * uVar118;
                    uVar119 = ((short)auVar107._2_2_ < (short)uVar119) * auVar107._2_2_ |
                              ((short)auVar107._2_2_ >= (short)uVar119) * uVar119;
                    uVar120 = ((short)auVar107._4_2_ < (short)uVar120) * auVar107._4_2_ |
                              ((short)auVar107._4_2_ >= (short)uVar120) * uVar120;
                    uVar121 = ((short)auVar107._6_2_ < (short)uVar121) * auVar107._6_2_ |
                              ((short)auVar107._6_2_ >= (short)uVar121) * uVar121;
                    uVar122 = ((short)auVar107._8_2_ < (short)uVar122) * auVar107._8_2_ |
                              ((short)auVar107._8_2_ >= (short)uVar122) * uVar122;
                    uVar123 = ((short)auVar107._10_2_ < (short)uVar123) * auVar107._10_2_ |
                              ((short)auVar107._10_2_ >= (short)uVar123) * uVar123;
                    uVar124 = ((short)auVar107._12_2_ < (short)uVar124) * auVar107._12_2_ |
                              ((short)auVar107._12_2_ >= (short)uVar124) * uVar124;
                    uVar125 = ((short)auVar107._14_2_ < (short)uVar125) * auVar107._14_2_ |
                              ((short)auVar107._14_2_ >= (short)uVar125) * uVar125;
                    auVar129._0_2_ =
                         (ushort)(sVar8 < sVar53) * sVar53 | (ushort)(sVar8 >= sVar53) * sVar8;
                    auVar129._2_2_ =
                         (ushort)(sVar11 < sVar66) * sVar66 | (ushort)(sVar11 >= sVar66) * sVar11;
                    auVar129._4_2_ =
                         (ushort)(sVar69 < sVar68) * sVar68 | (ushort)(sVar69 >= sVar68) * sVar69;
                    auVar129._6_2_ =
                         (ushort)(sVar77 < sVar70) * sVar70 | (ushort)(sVar77 >= sVar70) * sVar77;
                    auVar129._8_2_ =
                         (ushort)(sVar14 < sVar71) * sVar71 | (ushort)(sVar14 >= sVar71) * sVar14;
                    auVar129._10_2_ =
                         (ushort)(sVar17 < sVar74) * sVar74 | (ushort)(sVar17 >= sVar74) * sVar17;
                    auVar129._12_2_ =
                         (ushort)(sVar20 < sVar76) * sVar76 | (ushort)(sVar20 >= sVar76) * sVar20;
                    auVar129._14_2_ =
                         (ushort)(sVar23 < sVar78) * sVar78 | (ushort)(sVar23 >= sVar78) * sVar23;
                    auVar58 = *(undefined1 (*) [16])((long)*ptr + lVar46);
                    lVar46 = lVar46 + 0x10;
                    uVar44 = uVar44 + 1;
                  } while (lVar43 != lVar46);
                  iVar38 = 0;
                  auVar104 = auVar129;
                  do {
                    uVar44 = (ulong)(uint)(ptr_03[uVar1] - open);
                    if (ptr_03[uVar1] - open < -0x7fff) {
                      uVar44 = 0xffff8000;
                    }
                    uVar81 = ptr[uVar39][0];
                    auVar108._8_8_ = ptr[uVar39][1] << 0x10 | uVar81 >> 0x30;
                    auVar108._0_8_ = uVar81 << 0x10 | (ulong)(ushort)ptr_03[uVar52];
                    uVar81 = auVar131._0_8_;
                    auVar131._8_8_ = auVar131._8_8_ << 0x10 | uVar81 >> 0x30;
                    auVar131._0_8_ = uVar81 << 0x10 | uVar44 & 0xffff;
                    uVar81 = auVar129._0_8_;
                    auVar129._8_8_ = auVar129._8_8_ << 0x10 | uVar81 >> 0x30;
                    auVar129._0_8_ = uVar81 << 0x10 | uVar44 & 0xffff;
                    uVar81 = auVar83._0_8_;
                    auVar83._8_8_ = auVar83._8_8_ << 0x10 | uVar81 >> 0x30;
                    local_f4 = (ushort)uVar37;
                    auVar83._0_8_ = uVar81 << 0x10 | (ulong)local_f4;
                    uVar81 = auVar104._0_8_;
                    auVar104._8_8_ = auVar104._8_8_ << 0x10 | uVar81 >> 0x30;
                    auVar104._0_8_ = uVar81 << 0x10 | uVar44 & 0xffff;
                    lVar46 = 0;
                    do {
                      auVar132._0_2_ = -(ushort)(auVar83._0_2_ < auVar131._0_2_);
                      auVar132._2_2_ = -(ushort)(auVar83._2_2_ < auVar131._2_2_);
                      auVar132._4_2_ = -(ushort)(auVar83._4_2_ < auVar131._4_2_);
                      auVar132._6_2_ = -(ushort)(auVar83._6_2_ < auVar131._6_2_);
                      auVar132._8_2_ = -(ushort)(auVar83._8_2_ < auVar131._8_2_);
                      auVar132._10_2_ = -(ushort)(auVar83._10_2_ < auVar131._10_2_);
                      auVar132._12_2_ = -(ushort)(auVar83._12_2_ < auVar131._12_2_);
                      auVar132._14_2_ = -(ushort)(auVar83._14_2_ < auVar131._14_2_);
                      psVar2 = (short *)((long)*ptr_04 + lVar46);
                      sVar54 = *psVar2;
                      sVar67 = psVar2[1];
                      sVar69 = psVar2[2];
                      sVar68 = psVar2[3];
                      sVar72 = psVar2[4];
                      sVar75 = psVar2[5];
                      sVar77 = psVar2[6];
                      sVar70 = psVar2[7];
                      sVar32 = auVar129._0_2_;
                      auVar84._0_2_ =
                           (ushort)(sVar54 < sVar32) * sVar32 | (ushort)(sVar54 >= sVar32) * sVar54;
                      sVar7 = auVar129._2_2_;
                      auVar84._2_2_ =
                           (ushort)(sVar67 < sVar7) * sVar7 | (ushort)(sVar67 >= sVar7) * sVar67;
                      sVar8 = auVar129._4_2_;
                      auVar84._4_2_ =
                           (ushort)(sVar69 < sVar8) * sVar8 | (ushort)(sVar69 >= sVar8) * sVar69;
                      sVar53 = auVar129._6_2_;
                      auVar84._6_2_ =
                           (ushort)(sVar68 < sVar53) * sVar53 | (ushort)(sVar68 >= sVar53) * sVar68;
                      sVar9 = auVar129._8_2_;
                      auVar84._8_2_ =
                           (ushort)(sVar72 < sVar9) * sVar9 | (ushort)(sVar72 >= sVar9) * sVar72;
                      sVar10 = auVar129._10_2_;
                      auVar84._10_2_ =
                           (ushort)(sVar75 < sVar10) * sVar10 | (ushort)(sVar75 >= sVar10) * sVar75;
                      sVar11 = auVar129._12_2_;
                      auVar84._12_2_ =
                           (ushort)(sVar77 < sVar11) * sVar11 | (ushort)(sVar77 >= sVar11) * sVar77;
                      sVar66 = auVar129._14_2_;
                      auVar84._14_2_ =
                           (ushort)(sVar70 < sVar66) * sVar66 | (ushort)(sVar70 >= sVar66) * sVar70;
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar46) = auVar84;
                      auVar58 = paddsw(auVar108,*(undefined1 (*) [16])
                                                 ((long)pvVar4 + lVar46 + lVar49 * 0x10));
                      auVar109._0_2_ = -(ushort)(auVar58._0_2_ == auVar84._0_2_);
                      auVar109._2_2_ = -(ushort)(auVar58._2_2_ == auVar84._2_2_);
                      auVar109._4_2_ = -(ushort)(auVar58._4_2_ == auVar84._4_2_);
                      auVar109._6_2_ = -(ushort)(auVar58._6_2_ == auVar84._6_2_);
                      auVar109._8_2_ = -(ushort)(auVar58._8_2_ == auVar84._8_2_);
                      auVar109._10_2_ = -(ushort)(auVar58._10_2_ == auVar84._10_2_);
                      auVar109._12_2_ = -(ushort)(auVar58._12_2_ == auVar84._12_2_);
                      auVar109._14_2_ = -(ushort)(auVar58._14_2_ == auVar84._14_2_);
                      auVar63._0_2_ = -(ushort)(sVar32 < sVar54);
                      auVar63._2_2_ = -(ushort)(sVar7 < sVar67);
                      auVar63._4_2_ = -(ushort)(sVar8 < sVar69);
                      auVar63._6_2_ = -(ushort)(sVar53 < sVar68);
                      auVar63._8_2_ = -(ushort)(sVar9 < sVar72);
                      auVar63._10_2_ = -(ushort)(sVar10 < sVar75);
                      auVar63._12_2_ = -(ushort)(sVar11 < sVar77);
                      auVar63._14_2_ = -(ushort)(sVar66 < sVar70);
                      auVar58 = *(undefined1 (*) [16])
                                 ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar45) &
                                _DAT_00906b90;
                      auVar130 = pblendvb(auVar59,*(undefined1 (*) [16])((long)*ptr_02 + lVar46),
                                          auVar63 | auVar109);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar46) = auVar130;
                      *(undefined1 (*) [16])
                       ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar45) =
                           auVar130 | auVar58;
                      piVar6 = ((ppVar34->field_4).rowcols)->score_row;
                      auVar58 = pblendvb(auVar138,auVar126,auVar132);
                      *(undefined1 (*) [16])((long)piVar6 + lVar46 + lVar45) =
                           *(undefined1 (*) [16])((long)piVar6 + lVar46 + lVar45) & _DAT_00906ba0 |
                           auVar58;
                      auVar25._4_4_ = uVar55;
                      auVar25._0_4_ = uVar55;
                      auVar25._8_4_ = uVar55;
                      auVar25._12_4_ = uVar55;
                      auVar131 = psubsw(auVar84,auVar25);
                      auVar28._4_4_ = uVar56;
                      auVar28._0_4_ = uVar56;
                      auVar28._8_4_ = uVar56;
                      auVar28._12_4_ = uVar56;
                      auVar58 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar46),auVar28);
                      sVar32 = auVar58._0_2_;
                      sVar54 = auVar131._0_2_;
                      sVar7 = auVar58._2_2_;
                      sVar67 = auVar131._2_2_;
                      sVar8 = auVar58._4_2_;
                      sVar69 = auVar131._4_2_;
                      sVar53 = auVar58._6_2_;
                      sVar68 = auVar131._6_2_;
                      sVar9 = auVar58._8_2_;
                      sVar72 = auVar131._8_2_;
                      sVar10 = auVar58._10_2_;
                      sVar75 = auVar131._10_2_;
                      sVar11 = auVar58._12_2_;
                      sVar77 = auVar131._12_2_;
                      sVar70 = auVar131._14_2_;
                      sVar66 = auVar58._14_2_;
                      puVar3 = (ushort *)((long)*local_e0 + lVar46);
                      *puVar3 = (ushort)(sVar54 < sVar32) * sVar32 |
                                (ushort)(sVar54 >= sVar32) * sVar54;
                      puVar3[1] = (ushort)(sVar67 < sVar7) * sVar7 |
                                  (ushort)(sVar67 >= sVar7) * sVar67;
                      puVar3[2] = (ushort)(sVar69 < sVar8) * sVar8 |
                                  (ushort)(sVar69 >= sVar8) * sVar69;
                      puVar3[3] = (ushort)(sVar68 < sVar53) * sVar53 |
                                  (ushort)(sVar68 >= sVar53) * sVar68;
                      puVar3[4] = (ushort)(sVar72 < sVar9) * sVar9 |
                                  (ushort)(sVar72 >= sVar9) * sVar72;
                      puVar3[5] = (ushort)(sVar75 < sVar10) * sVar10 |
                                  (ushort)(sVar75 >= sVar10) * sVar75;
                      puVar3[6] = (ushort)(sVar77 < sVar11) * sVar11 |
                                  (ushort)(sVar77 >= sVar11) * sVar77;
                      puVar3[7] = (ushort)(sVar70 < sVar66) * sVar66 |
                                  (ushort)(sVar70 >= sVar66) * sVar70;
                      if (uVar1 < uVar73) {
                        auVar64._0_2_ = -(ushort)(sVar32 < sVar54);
                        auVar64._2_2_ = -(ushort)(sVar7 < sVar67);
                        auVar64._4_2_ = -(ushort)(sVar8 < sVar69);
                        auVar64._6_2_ = -(ushort)(sVar53 < sVar68);
                        auVar64._8_2_ = -(ushort)(sVar9 < sVar72);
                        auVar64._10_2_ = -(ushort)(sVar10 < sVar75);
                        auVar64._12_2_ = -(ushort)(sVar11 < sVar77);
                        auVar64._14_2_ = -(ushort)(sVar66 < sVar70);
                        auVar58 = pblendvb(auVar128,_DAT_00904d20,auVar64);
                        *(undefined1 (*) [16])
                         ((long)((ppVar34->field_4).rowcols)->score_row + lVar46 + lVar40) = auVar58
                        ;
                      }
                      uVar118 = ((short)auVar84._0_2_ < (short)uVar118) * auVar84._0_2_ |
                                ((short)auVar84._0_2_ >= (short)uVar118) * uVar118;
                      uVar119 = ((short)auVar84._2_2_ < (short)uVar119) * auVar84._2_2_ |
                                ((short)auVar84._2_2_ >= (short)uVar119) * uVar119;
                      uVar120 = ((short)auVar84._4_2_ < (short)uVar120) * auVar84._4_2_ |
                                ((short)auVar84._4_2_ >= (short)uVar120) * uVar120;
                      uVar121 = ((short)auVar84._6_2_ < (short)uVar121) * auVar84._6_2_ |
                                ((short)auVar84._6_2_ >= (short)uVar121) * uVar121;
                      uVar122 = ((short)auVar84._8_2_ < (short)uVar122) * auVar84._8_2_ |
                                ((short)auVar84._8_2_ >= (short)uVar122) * uVar122;
                      uVar123 = ((short)auVar84._10_2_ < (short)uVar123) * auVar84._10_2_ |
                                ((short)auVar84._10_2_ >= (short)uVar123) * uVar123;
                      uVar124 = ((short)auVar84._12_2_ < (short)uVar124) * auVar84._12_2_ |
                                ((short)auVar84._12_2_ >= (short)uVar124) * uVar124;
                      uVar125 = ((short)auVar84._14_2_ < (short)uVar125) * auVar84._14_2_ |
                                ((short)auVar84._14_2_ >= (short)uVar125) * uVar125;
                      uVar110 = ((short)uVar110 < (short)auVar84._0_2_) * auVar84._0_2_ |
                                ((short)uVar110 >= (short)auVar84._0_2_) * uVar110;
                      uVar111 = ((short)uVar111 < (short)auVar84._2_2_) * auVar84._2_2_ |
                                ((short)uVar111 >= (short)auVar84._2_2_) * uVar111;
                      uVar112 = ((short)uVar112 < (short)auVar84._4_2_) * auVar84._4_2_ |
                                ((short)uVar112 >= (short)auVar84._4_2_) * uVar112;
                      uVar113 = ((short)uVar113 < (short)auVar84._6_2_) * auVar84._6_2_ |
                                ((short)uVar113 >= (short)auVar84._6_2_) * uVar113;
                      uVar114 = ((short)uVar114 < (short)auVar84._8_2_) * auVar84._8_2_ |
                                ((short)uVar114 >= (short)auVar84._8_2_) * uVar114;
                      uVar115 = ((short)uVar115 < (short)auVar84._10_2_) * auVar84._10_2_ |
                                ((short)uVar115 >= (short)auVar84._10_2_) * uVar115;
                      uVar116 = ((short)uVar116 < (short)auVar84._12_2_) * auVar84._12_2_ |
                                ((short)uVar116 >= (short)auVar84._12_2_) * uVar116;
                      uVar117 = ((short)uVar117 < (short)auVar84._14_2_) * auVar84._14_2_ |
                                ((short)uVar117 >= (short)auVar84._14_2_) * uVar117;
                      auVar29._4_4_ = uVar56;
                      auVar29._0_4_ = uVar56;
                      auVar29._8_4_ = uVar56;
                      auVar29._12_4_ = uVar56;
                      auVar129 = psubsw(auVar129,auVar29);
                      auVar65._0_2_ = -(ushort)(auVar129._0_2_ < sVar54);
                      auVar65._2_2_ = -(ushort)(auVar129._2_2_ < sVar67);
                      auVar65._4_2_ = -(ushort)(auVar129._4_2_ < sVar69);
                      auVar65._6_2_ = -(ushort)(auVar129._6_2_ < sVar68);
                      auVar65._8_2_ = -(ushort)(auVar129._8_2_ < sVar72);
                      auVar65._10_2_ = -(ushort)(auVar129._10_2_ < sVar75);
                      auVar65._12_2_ = -(ushort)(auVar129._12_2_ < sVar77);
                      auVar65._14_2_ = -(ushort)(auVar129._14_2_ < sVar70);
                      if ((ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar65._14_2_ >> 7) & 1) << 0xe |
                                  auVar65._14_2_ & 0x8000) == 0xffff) goto LAB_0075c581;
                      auVar30._4_4_ = uVar56;
                      auVar30._0_4_ = uVar56;
                      auVar30._8_4_ = uVar56;
                      auVar30._12_4_ = uVar56;
                      auVar83 = psubsw(auVar104,auVar30);
                      sVar32 = auVar83._0_2_;
                      auVar104._0_2_ =
                           (ushort)(sVar54 < sVar32) * sVar32 | (ushort)(sVar54 >= sVar32) * sVar54;
                      sVar32 = auVar83._2_2_;
                      auVar104._2_2_ =
                           (ushort)(sVar67 < sVar32) * sVar32 | (ushort)(sVar67 >= sVar32) * sVar67;
                      sVar32 = auVar83._4_2_;
                      auVar104._4_2_ =
                           (ushort)(sVar69 < sVar32) * sVar32 | (ushort)(sVar69 >= sVar32) * sVar69;
                      sVar32 = auVar83._6_2_;
                      auVar104._6_2_ =
                           (ushort)(sVar68 < sVar32) * sVar32 | (ushort)(sVar68 >= sVar32) * sVar68;
                      sVar32 = auVar83._8_2_;
                      auVar104._8_2_ =
                           (ushort)(sVar72 < sVar32) * sVar32 | (ushort)(sVar72 >= sVar32) * sVar72;
                      sVar32 = auVar83._10_2_;
                      auVar104._10_2_ =
                           (ushort)(sVar75 < sVar32) * sVar32 | (ushort)(sVar75 >= sVar32) * sVar75;
                      sVar32 = auVar83._12_2_;
                      auVar104._12_2_ =
                           (ushort)(sVar77 < sVar32) * sVar32 | (ushort)(sVar77 >= sVar32) * sVar77;
                      sVar32 = auVar83._14_2_;
                      auVar104._14_2_ =
                           (ushort)(sVar70 < sVar32) * sVar32 | (ushort)(sVar70 >= sVar32) * sVar70;
                      auVar108 = *(undefined1 (*) [16])((long)*ptr + lVar46);
                      lVar46 = lVar46 + 0x10;
                    } while (lVar43 != lVar46);
                    iVar38 = iVar38 + 1;
                  } while (iVar38 != 8);
LAB_0075c581:
                  lVar40 = lVar40 + lVar43;
                  lVar45 = lVar45 + lVar43;
                  palVar35 = ptr_04;
                  uVar52 = uVar1;
                  palVar36 = local_e0;
                  if (uVar1 == uVar73) {
                    uVar73 = ptr_04[(ulong)uVar41 % uVar50][1];
                    if (iVar51 < 7) {
                      iVar38 = 0;
                      uVar50 = ptr_04[(ulong)uVar41 % uVar50][0];
                      do {
                        uVar73 = uVar73 << 0x10 | uVar50 >> 0x30;
                        iVar38 = iVar38 + 1;
                        uVar50 = uVar50 << 0x10;
                      } while (iVar38 < 7 - iVar51);
                    }
                    auVar57._0_2_ = -(ushort)((short)uVar118 < (short)local_78);
                    auVar57._2_2_ = -(ushort)((short)uVar119 < (short)uStack_76);
                    auVar57._4_2_ = -(ushort)((short)uVar120 < (short)local_78);
                    auVar57._6_2_ = -(ushort)((short)uVar121 < (short)uStack_76);
                    auVar57._8_2_ = -(ushort)((short)uVar122 < (short)local_78);
                    auVar57._10_2_ = -(ushort)((short)uVar123 < (short)uStack_76);
                    auVar57._12_2_ = -(ushort)((short)uVar124 < (short)local_78);
                    auVar57._14_2_ = -(ushort)((short)uVar125 < (short)uStack_76);
                    auVar127._0_2_ = -(ushort)((short)local_88 < (short)uVar110);
                    auVar127._2_2_ = -(ushort)((short)uStack_86 < (short)uVar111);
                    auVar127._4_2_ = -(ushort)((short)local_88 < (short)uVar112);
                    auVar127._6_2_ = -(ushort)((short)uStack_86 < (short)uVar113);
                    auVar127._8_2_ = -(ushort)((short)local_88 < (short)uVar114);
                    auVar127._10_2_ = -(ushort)((short)uStack_86 < (short)uVar115);
                    auVar127._12_2_ = -(ushort)((short)local_88 < (short)uVar116);
                    auVar127._14_2_ = -(ushort)((short)uStack_86 < (short)uVar117);
                    auVar127 = auVar127 | auVar57;
                    if ((((((((((((((((auVar127 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar127 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar127 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar127 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar127 >> 0x27 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar127 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar127 >> 0x37 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar127 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar127 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar127 >> 0x4f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar127 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar127 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar127 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar127 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar127 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar127[0xf]) {
                      sVar32 = (short)(uVar73 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar34->flag = (byte)ppVar34->flag | 0x40;
                      sVar32 = 0;
                      iVar33 = 0;
                      uVar41 = 0;
                    }
                    ppVar34->score = (int)sVar32;
                    ppVar34->end_query = uVar41;
                    ppVar34->end_ref = iVar33;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_e0);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_04);
                    return ppVar34;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8(
                        _mm_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}